

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

bool __thiscall
cmServerProtocol1::DoActivate(cmServerProtocol1 *this,cmServerRequest *request,string *errorMessage)

{
  anon_class_16_2_b7cf16a7_for__M_pred __pred;
  bool bVar1;
  Value *pVVar2;
  ulong uVar3;
  cmState *pcVar4;
  pointer pGVar5;
  GeneratorInformation local_6d8;
  allocator local_611;
  string local_610;
  allocator local_5e9;
  string local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_548;
  string *local_540;
  string *local_538;
  GeneratorInfo *local_530;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_528;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_520;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  extraIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_4b0;
  string *local_4a8;
  GeneratorInfo *local_4a0;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_498;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  local_490;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  baseIt;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generators;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  allocator local_401;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  allocator local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  allocator local_331;
  string local_330;
  allocator local_309;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  cmState *local_1f8;
  cmState *state;
  string cachePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  cmake *local_168;
  cmake *cm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string platform;
  string toolset;
  string extraGenerator;
  string generator;
  undefined1 local_68 [8];
  string buildDirectory;
  string sourceDirectory;
  string *errorMessage_local;
  cmServerRequest *request_local;
  cmServerProtocol1 *this_local;
  
  pVVar2 = Json::Value::operator[](&request->Data,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)((long)&buildDirectory.field_2 + 8),pVVar2);
  pVVar2 = Json::Value::operator[](&request->Data,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)local_68,pVVar2);
  pVVar2 = Json::Value::operator[](&request->Data,&kGENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)((long)&extraGenerator.field_2 + 8),pVVar2);
  pVVar2 = Json::Value::operator[](&request->Data,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)((long)&toolset.field_2 + 8),pVVar2);
  pVVar2 = Json::Value::operator[](&request->Data,&kTOOLSET_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)((long)&platform.field_2 + 8),pVVar2);
  pVVar2 = Json::Value::operator[](&request->Data,&kPLATFORM_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_((string *)local_f8,pVVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,"\"",(allocator *)((long)&cm + 7));
    std::operator+(&local_138,&local_158,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
    std::operator+(&local_118,&local_138,"\" is missing.");
    setErrorMessage(errorMessage,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cm + 7));
    this_local._7_1_ = 0;
    cm._0_4_ = 1;
    goto LAB_0087f485;
  }
  local_168 = cmServerProtocol::CMakeInstance(&this->super_cmServerProtocol);
  bVar1 = cmsys::SystemTools::PathExists((string *)local_68);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_68);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1c8,"\"",(allocator *)(cachePath.field_2._M_local_buf + 0xf));
      std::operator+(&local_1a8,&local_1c8,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
      std::operator+(&local_188,&local_1a8,"\" exists but is not a directory.");
      setErrorMessage(errorMessage,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)(cachePath.field_2._M_local_buf + 0xf));
      this_local._7_1_ = 0;
      cm._0_4_ = 1;
      goto LAB_0087f485;
    }
    cmake::FindCacheFile((string *)&state,(string *)local_68);
    bVar1 = cmake::LoadCache(local_168,(string *)&state);
    if (bVar1) {
      pcVar4 = cmake::GetState(local_168);
      local_1f8 = pcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_218,"CMAKE_GENERATOR",&local_219);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_240,"generator",&local_241);
      bVar1 = testValue(pcVar4,&local_218,(string *)((long)&extraGenerator.field_2 + 8),&local_240,
                        errorMessage);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      pcVar4 = local_1f8;
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_268,"CMAKE_EXTRA_GENERATOR",&local_269);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_290,"extra generator",&local_291);
        bVar1 = testValue(pcVar4,&local_268,(string *)((long)&toolset.field_2 + 8),&local_290,
                          errorMessage);
        std::__cxx11::string::~string((string *)&local_290);
        std::allocator<char>::~allocator((allocator<char> *)&local_291);
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator((allocator<char> *)&local_269);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          bVar1 = testHomeDirectory(local_1f8,(string *)((long)&buildDirectory.field_2 + 8),
                                    errorMessage);
          pcVar4 = local_1f8;
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_2b8,"CMAKE_GENERATOR_TOOLSET",&local_2b9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_2e0,"toolset",&local_2e1);
            bVar1 = testValue(pcVar4,&local_2b8,(string *)((long)&platform.field_2 + 8),&local_2e0,
                              errorMessage);
            std::__cxx11::string::~string((string *)&local_2e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
            pcVar4 = local_1f8;
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_308,"CMAKE_GENERATOR_PLATFORM",&local_309);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_330,"platform",&local_331);
              bVar1 = testValue(pcVar4,&local_308,(string *)local_f8,&local_330,errorMessage);
              std::__cxx11::string::~string((string *)&local_330);
              std::allocator<char>::~allocator((allocator<char> *)&local_331);
              std::__cxx11::string::~string((string *)&local_308);
              std::allocator<char>::~allocator((allocator<char> *)&local_309);
              if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0087ea25;
              this_local._7_1_ = 0;
              cm._0_4_ = 1;
            }
            else {
              this_local._7_1_ = 0;
              cm._0_4_ = 1;
            }
          }
          else {
            this_local._7_1_ = 0;
            cm._0_4_ = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
          cm._0_4_ = 1;
        }
      }
      else {
        this_local._7_1_ = 0;
        cm._0_4_ = 1;
      }
    }
    else {
LAB_0087ea25:
      cm._0_4_ = 0;
    }
    std::__cxx11::string::~string((string *)&state);
    if ((int)cm != 0) goto LAB_0087f485;
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)((long)&buildDirectory.field_2 + 8));
    if (bVar1) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::vector
                  ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)&baseIt);
        cmake::GetRegisteredGenerators
                  (local_168,
                   (vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)&baseIt);
        local_498._M_current =
             (GeneratorInfo *)
             std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::begin
                       ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
                        &baseIt);
        local_4a0 = (GeneratorInfo *)
                    std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::end
                              ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                                *)&baseIt);
        local_4a8 = (string *)((long)&extraGenerator.field_2 + 8);
        local_490 = std::
                    find_if<__gnu_cxx::__normal_iterator<cmake::GeneratorInfo*,std::vector<cmake::GeneratorInfo,std::allocator<cmake::GeneratorInfo>>>,cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                              (local_498,
                               (__normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                                )local_4a0,(anon_class_8_1_26b32173_for__M_pred)local_4a8);
        local_4b0._M_current =
             (GeneratorInfo *)
             std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::end
                       ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
                        &baseIt);
        bVar1 = __gnu_cxx::operator==(&local_490,&local_4b0);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_510,"Generator \"",
                     (allocator *)((long)&extraIt._M_current + 7));
          std::operator+(&local_4f0,&local_510,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&extraGenerator.field_2 + 8));
          std::operator+(&local_4d0,&local_4f0,"\" not supported.");
          setErrorMessage(errorMessage,&local_4d0);
          std::__cxx11::string::~string((string *)&local_4d0);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::__cxx11::string::~string((string *)&local_510);
          std::allocator<char>::~allocator((allocator<char> *)((long)&extraIt._M_current + 7));
          this_local._7_1_ = 0;
        }
        else {
          local_528._M_current =
               (GeneratorInfo *)
               std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::begin
                         ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
                          &baseIt);
          local_530 = (GeneratorInfo *)
                      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::end
                                ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                                  *)&baseIt);
          local_540 = (string *)((long)&extraGenerator.field_2 + 8);
          local_538 = (string *)((long)&toolset.field_2 + 8);
          __pred.extraGenerator = local_538;
          __pred.generator = local_540;
          local_520 = std::
                      find_if<__gnu_cxx::__normal_iterator<cmake::GeneratorInfo*,std::vector<cmake::GeneratorInfo,std::allocator<cmake::GeneratorInfo>>>,cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                (local_528,
                                 (__normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                                  )local_530,__pred);
          local_548._M_current =
               (GeneratorInfo *)
               std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::end
                         ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
                          &baseIt);
          bVar1 = __gnu_cxx::operator==(&local_520,&local_548);
          if (bVar1) {
            std::operator+(&local_5c8,"The combination of generator \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&extraGenerator.field_2 + 8));
            std::operator+(&local_5a8,&local_5c8,"\" and extra generator \"");
            std::operator+(&local_588,&local_5a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&toolset.field_2 + 8));
            std::operator+(&local_568,&local_588,"\" is not supported.");
            setErrorMessage(errorMessage,&local_568);
            std::__cxx11::string::~string((string *)&local_568);
            std::__cxx11::string::~string((string *)&local_588);
            std::__cxx11::string::~string((string *)&local_5a8);
            std::__cxx11::string::~string((string *)&local_5c8);
            this_local._7_1_ = 0;
          }
          else {
            pGVar5 = __gnu_cxx::
                     __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                     ::operator->(&local_520);
            if (((pGVar5->supportsToolset & 1U) == 0) &&
               (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_5e8,
                         "Toolset was provided but is not supported by the requested generator.",
                         &local_5e9);
              setErrorMessage(errorMessage,&local_5e8);
              std::__cxx11::string::~string((string *)&local_5e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
              this_local._7_1_ = 0;
            }
            else {
              pGVar5 = __gnu_cxx::
                       __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                       ::operator->(&local_520);
              if (((pGVar5->supportsPlatform & 1U) == 0) &&
                 (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_610,
                           "Platform was provided but is not supported by the requested generator.",
                           &local_611);
                setErrorMessage(errorMessage,&local_610);
                std::__cxx11::string::~string((string *)&local_610);
                std::allocator<char>::~allocator((allocator<char> *)&local_611);
                this_local._7_1_ = 0;
              }
              else {
                GeneratorInformation::GeneratorInformation
                          (&local_6d8,(string *)((long)&extraGenerator.field_2 + 8),
                           (string *)((long)&toolset.field_2 + 8),
                           (string *)((long)&platform.field_2 + 8),(string *)local_f8,
                           (string *)((long)&buildDirectory.field_2 + 8),(string *)local_68);
                GeneratorInformation::operator=(&this->GeneratorInfo,&local_6d8);
                GeneratorInformation::~GeneratorInformation(&local_6d8);
                this->m_State = STATE_ACTIVE;
                this_local._7_1_ = 1;
              }
            }
          }
        }
        cm._0_4_ = 1;
        std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
                  ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)&baseIt);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_468,"\"",
                   (allocator *)
                   ((long)&generators.
                           super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::operator+(&local_448,&local_468,&kGENERATOR_KEY_abi_cxx11_);
        std::operator+(&local_428,&local_448,"\" is unset but required.");
        setErrorMessage(errorMessage,&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_468);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&generators.
                           super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        this_local._7_1_ = 0;
        cm._0_4_ = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_400,"\"",&local_401);
      std::operator+(&local_3e0,&local_400,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
      std::operator+(&local_3c0,&local_3e0,"\" is not a directory.");
      setErrorMessage(errorMessage,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_400);
      std::allocator<char>::~allocator((allocator<char> *)&local_401);
      this_local._7_1_ = 0;
      cm._0_4_ = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_398,"\"",&local_399);
    std::operator+(&local_378,&local_398,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
    std::operator+(&local_358,&local_378,"\" is unset but required.");
    setErrorMessage(errorMessage,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
    this_local._7_1_ = 0;
    cm._0_4_ = 1;
  }
LAB_0087f485:
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)(platform.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(toolset.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(extraGenerator.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(buildDirectory.field_2._M_local_buf + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmServerProtocol1::DoActivate(const cmServerRequest& request,
                                   std::string* errorMessage)
{
  std::string sourceDirectory = request.Data[kSOURCE_DIRECTORY_KEY].asString();
  const std::string buildDirectory =
    request.Data[kBUILD_DIRECTORY_KEY].asString();
  std::string generator = request.Data[kGENERATOR_KEY].asString();
  std::string extraGenerator = request.Data[kEXTRA_GENERATOR_KEY].asString();
  std::string toolset = request.Data[kTOOLSET_KEY].asString();
  std::string platform = request.Data[kPLATFORM_KEY].asString();

  if (buildDirectory.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kBUILD_DIRECTORY_KEY +
                      "\" is missing.");
    return false;
  }

  cmake* cm = CMakeInstance();
  if (cmSystemTools::PathExists(buildDirectory)) {
    if (!cmSystemTools::FileIsDirectory(buildDirectory)) {
      setErrorMessage(errorMessage, std::string("\"") + kBUILD_DIRECTORY_KEY +
                        "\" exists but is not a directory.");
      return false;
    }

    const std::string cachePath = cm->FindCacheFile(buildDirectory);
    if (cm->LoadCache(cachePath)) {
      cmState* state = cm->GetState();

      // Check generator:
      if (!testValue(state, "CMAKE_GENERATOR", generator, "generator",
                     errorMessage)) {
        return false;
      }

      // check extra generator:
      if (!testValue(state, "CMAKE_EXTRA_GENERATOR", extraGenerator,
                     "extra generator", errorMessage)) {
        return false;
      }

      // check sourcedir:
      if (!testHomeDirectory(state, sourceDirectory, errorMessage)) {
        return false;
      }

      // check toolset:
      if (!testValue(state, "CMAKE_GENERATOR_TOOLSET", toolset, "toolset",
                     errorMessage)) {
        return false;
      }

      // check platform:
      if (!testValue(state, "CMAKE_GENERATOR_PLATFORM", platform, "platform",
                     errorMessage)) {
        return false;
      }
    }
  }

  if (sourceDirectory.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is unset but required.");
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDirectory)) {
    setErrorMessage(errorMessage, std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is not a directory.");
    return false;
  }
  if (generator.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kGENERATOR_KEY +
                      "\" is unset but required.");
    return false;
  }

  std::vector<cmake::GeneratorInfo> generators;
  cm->GetRegisteredGenerators(generators);
  auto baseIt = std::find_if(generators.begin(), generators.end(),
                             [&generator](const cmake::GeneratorInfo& info) {
                               return info.name == generator;
                             });
  if (baseIt == generators.end()) {
    setErrorMessage(errorMessage, std::string("Generator \"") + generator +
                      "\" not supported.");
    return false;
  }
  auto extraIt = std::find_if(
    generators.begin(), generators.end(),
    [&generator, &extraGenerator](const cmake::GeneratorInfo& info) {
      return info.baseName == generator && info.extraName == extraGenerator;
    });
  if (extraIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("The combination of generator \"" + generator +
                                "\" and extra generator \"" + extraGenerator +
                                "\" is not supported."));
    return false;
  }
  if (!extraIt->supportsToolset && !toolset.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Toolset was provided but is not supported by "
                                "the requested generator."));
    return false;
  }
  if (!extraIt->supportsPlatform && !platform.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Platform was provided but is not supported "
                                "by the requested generator."));
    return false;
  }

  this->GeneratorInfo =
    GeneratorInformation(generator, extraGenerator, toolset, platform,
                         sourceDirectory, buildDirectory);

  this->m_State = STATE_ACTIVE;
  return true;
}